

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy.h
# Opt level: O2

int64_t __thiscall
disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>::
WaitFor<long,std::ratio<1l,1l>>
          (SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1> *this,
          int64_t *sequence,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          atomic<bool> *alerted,duration<long,_std::ratio<1L,_1L>_> *timeout)

{
  long lVar1;
  long lVar2;
  long lVar3;
  code *pcVar4;
  code *pcVar5;
  int64_t counter;
  bool bVar6;
  long lStack_60;
  function<long_()> min_sequence;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  lVar1 = timeout->__r;
  bVar6 = (dependents->
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>)._M_impl
          .super__Vector_impl_data._M_finish !=
          (dependents->
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>)._M_impl
          .super__Vector_impl_data._M_start;
  if (bVar6) {
    cursor = (Sequence *)dependents;
  }
  pcVar4 = std::
           _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:383:12)>
           ::_M_invoke;
  if (!bVar6) {
    pcVar4 = std::
             _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:381:12)>
             ::_M_invoke;
  }
  pcVar5 = std::
           _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:383:12)>
           ::_M_manager;
  if (!bVar6) {
    pcVar5 = std::
             _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:381:12)>
             ::_M_manager;
  }
  min_sequence.super__Function_base._M_functor._8_8_ = 0;
  counter = 200;
  min_sequence.super__Function_base._M_functor._M_unused._M_object = cursor;
  min_sequence.super__Function_base._M_manager = pcVar5;
  min_sequence._M_invoker = pcVar4;
  do {
    lStack_60 = std::function<long_()>::operator()(&min_sequence);
    if (*sequence <= lStack_60) goto LAB_00111920;
    if (((alerted->_M_base)._M_i & 1U) != 0) {
      lStack_60 = -2;
      goto LAB_00111920;
    }
    counter = SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>::
              ApplyWaitMethod((SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>
                               *)this,counter);
    lVar3 = std::chrono::_V2::system_clock::now();
  } while (lVar3 < lVar1 * 1000000000 + lVar2);
  lStack_60 = -3;
LAB_00111920:
  std::_Function_base::~_Function_base(&min_sequence.super__Function_base);
  return lStack_60;
}

Assistant:

int64_t WaitFor(const int64_t& sequence, const Sequence& cursor,
                  const std::vector<Sequence*>& dependents,
                  const std::atomic<bool>& alerted,
                  const std::chrono::duration<R, P>& timeout) {
    int64_t available_sequence = kInitialCursorValue;
    int64_t counter = S;

    const auto start = std::chrono::system_clock::now();
    const auto stop = start + timeout;
    const auto min_sequence = buildMinSequenceFunction(cursor, dependents);

    while ((available_sequence = min_sequence()) < sequence) {
      if (alerted.load()) return kAlertedSignal;

      counter = ApplyWaitMethod(counter);

      if (stop <= std::chrono::system_clock::now()) return kTimeoutSignal;
    }

    return available_sequence;
  }